

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogDerivativesStates
          (BeagleCPUImpl<double,_1,_0> *this,int *tipStates,double *preOrderPartial,
          int firstDerivativeIndex,int secondDerivativeIndex,double *categoryRates,
          double *categoryWeights,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  ulong uVar11;
  long lVar12;
  double *pdVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double *local_70;
  
  iVar3 = this->kCategoryCount;
  if (0 < (long)iVar3) {
    pdVar8 = this->gTransitionMatrices[firstDerivativeIndex];
    uVar4 = this->kPatternCount;
    uVar5 = this->kStateCount;
    lVar16 = (long)this->kPartialsPaddedStateCount;
    pdVar9 = this->grandNumeratorDerivTmp;
    pdVar10 = this->grandDenominatorDerivTmp;
    lVar12 = 0;
    local_70 = preOrderPartial;
    do {
      if (0 < (int)uVar4) {
        iVar6 = this->kTransPaddedStateCount;
        iVar7 = this->kMatrixSize;
        uVar15 = 0;
        pdVar13 = local_70;
        do {
          if ((int)uVar5 < 1) {
            auVar17 = ZEXT816(0);
          }
          else {
            iVar14 = tipStates[uVar15] + iVar7 * (int)lVar12;
            auVar17 = ZEXT816(0);
            uVar11 = 0;
            do {
              auVar19._8_8_ = 0;
              auVar19._0_8_ = pdVar8[iVar14];
              auVar1._8_8_ = 0;
              auVar1._0_8_ = pdVar13[uVar11];
              auVar17 = vfmadd231sd_fma(auVar17,auVar19,auVar1);
              uVar11 = uVar11 + 1;
              iVar14 = iVar14 + iVar6;
            } while (uVar5 != uVar11);
          }
          auVar20._8_8_ = 0;
          auVar20._0_8_ =
               preOrderPartial
               [(lVar12 * (int)uVar4 + uVar15) * lVar16 + (long)(tipStates[uVar15] % (int)uVar5)];
          auVar21._8_8_ = 0;
          auVar21._0_8_ = categoryWeights[lVar12];
          auVar2._8_8_ = 0;
          auVar2._0_8_ = pdVar9[uVar15];
          auVar17 = vfmadd213sd_fma(auVar21,auVar17,auVar2);
          pdVar9[uVar15] = auVar17._0_8_;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = categoryWeights[lVar12];
          auVar17._8_8_ = 0;
          auVar17._0_8_ = pdVar10[uVar15];
          auVar17 = vfmadd213sd_fma(auVar18,auVar20,auVar17);
          pdVar10[uVar15] = auVar17._0_8_;
          uVar15 = uVar15 + 1;
          pdVar13 = pdVar13 + lVar16;
        } while (uVar15 != uVar4);
      }
      lVar12 = lVar12 + 1;
      local_70 = local_70 + (int)uVar4 * lVar16;
    } while (lVar12 != iVar3);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogDerivativesStates(const int *tipStates,
                                                                     const REALTYPE *preOrderPartial,
                                                                     const int firstDerivativeIndex,
                                                                     const int secondDerivativeIndex,
                                                                     const double *categoryRates,
                                                                     const REALTYPE *categoryWeights,
                                                                     double *outDerivatives,
                                                                     double *outSumDerivatives,
                                                                     double *outSumSquaredDerivatives) {

    const REALTYPE *firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];

    for (int category = 0; category < kCategoryCount; category++) {

        for (int pattern = 0; pattern < kPatternCount; pattern++) {

            const int patternIndex = category * kPatternCount + pattern;
            const int state = tipStates[pattern];

            REALTYPE numerator = 0.0;
            REALTYPE denominator = preOrderPartial[patternIndex * kPartialsPaddedStateCount + (state % kStateCount)];
            // TODO (state % kStateCount) is not correct; should imply missing character
            // TODO See calcCrossProductsStates() for possible solution

            for (int k = 0; k < kStateCount; k++) {
                numerator += firstDerivMatrix[category * kMatrixSize + k * kTransPaddedStateCount + state] *
                             preOrderPartial[patternIndex * kPartialsPaddedStateCount + k];
            }

            grandNumeratorDerivTmp[pattern] += categoryWeights[category] * numerator;
            grandDenominatorDerivTmp[pattern] += categoryWeights[category] * denominator;
        }
    }
}